

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_float(void)

{
  XSValue_Data actValue;
  XSValue_Data actValue_00;
  XSValue_Data actValue_01;
  XSValue_Data actValue_02;
  XSValue_Data actValue_03;
  XSValue_Data actValue_04;
  XSValue_Data actValue_05;
  XSValue_Data actValue_06;
  XSValue_Data actValue_07;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  XSValue_Data expValue_02;
  XSValue_Data expValue_03;
  XSValue_Data expValue_04;
  XSValue_Data expValue_05;
  XSValue_Data expValue_06;
  XSValue_Data expValue_07;
  byte bVar1;
  bool bVar2;
  XMLCh *pXVar3;
  char *pcVar4;
  XSValue *pXVar5;
  char *pcVar6;
  char *pcVar7;
  wchar16 *pwVar8;
  long lVar9;
  void *pvVar10;
  bool bVar11;
  StrX local_d28;
  StrX local_d18;
  char *local_d08;
  char *actRetCanRep_inchar_8;
  wchar16 *local_cf0;
  XMLCh *actRetCanRep_10;
  undefined1 local_ce0 [4];
  Status myStatus_32;
  StrX local_cd0;
  char *local_cc0;
  char *actRetCanRep_inchar_7;
  wchar16 *local_ca8;
  XMLCh *actRetCanRep_9;
  undefined1 local_c98 [4];
  Status myStatus_31;
  StrX local_c88;
  char *local_c78;
  char *actRetCanRep_inchar_6;
  wchar16 *local_c60;
  XMLCh *actRetCanRep_8;
  undefined1 local_c50 [4];
  Status myStatus_30;
  StrX local_c40;
  char *local_c30;
  char *actRetCanRep_inchar_5;
  wchar16 *local_c18;
  XMLCh *actRetCanRep_7;
  undefined1 local_c08 [4];
  Status myStatus_29;
  StrX local_bf8;
  StrX local_be8;
  long local_bd8;
  XMLCh *actRetCanRep_6;
  undefined1 local_bc8 [4];
  Status myStatus_28;
  StrX local_bb8;
  StrX local_ba8;
  long local_b98;
  XMLCh *actRetCanRep_5;
  undefined1 local_b88 [4];
  Status myStatus_27;
  StrX local_b78;
  char *local_b68;
  char *actRetCanRep_inchar_4;
  wchar16 *local_b50;
  XMLCh *actRetCanRep_4;
  undefined1 local_b40 [4];
  Status myStatus_26;
  StrX local_b30;
  char *local_b20;
  char *actRetCanRep_inchar_3;
  wchar16 *local_b08;
  XMLCh *actRetCanRep_3;
  undefined1 local_af8 [4];
  Status myStatus_25;
  StrX local_ae8;
  char *local_ad8;
  char *actRetCanRep_inchar_2;
  wchar16 *local_ac0;
  XMLCh *actRetCanRep_2;
  undefined1 local_ab0 [4];
  Status myStatus_24;
  StrX local_aa0;
  char *local_a90;
  char *actRetCanRep_inchar_1;
  wchar16 *local_a78;
  XMLCh *actRetCanRep_1;
  undefined1 local_a68 [4];
  Status myStatus_23;
  StrX local_a58;
  char *local_a48;
  char *actRetCanRep_inchar;
  wchar16 *local_a30;
  XMLCh *actRetCanRep;
  Status myStatus_22;
  int j;
  StrX local_a10;
  StrX local_a00;
  XSValue *local_9f0;
  XSValue *actRetValue_10;
  undefined1 local_9e0 [4];
  Status myStatus_21;
  StrX local_9d0;
  StrX local_9c0;
  XSValue *local_9b0;
  XSValue *actRetValue_9;
  undefined1 local_9a0 [4];
  Status myStatus_20;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 local_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  StrX local_940;
  XSValue *local_930;
  XSValue *actRetValue_8;
  undefined1 local_920 [4];
  Status myStatus_19;
  undefined8 local_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  StrX local_8c0;
  XSValue *local_8b0;
  XSValue *actRetValue_7;
  undefined1 local_8a0 [4];
  Status myStatus_18;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  StrX local_840;
  XSValue *local_830;
  XSValue *actRetValue_6;
  undefined1 local_820 [4];
  Status myStatus_17;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  StrX local_7c0;
  XSValue *local_7b0;
  XSValue *actRetValue_5;
  undefined1 local_7a0 [4];
  Status myStatus_16;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  StrX local_740;
  XSValue *local_730;
  XSValue *actRetValue_4;
  undefined1 local_720 [4];
  Status myStatus_15;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  StrX local_6c0;
  XSValue *local_6b0;
  XSValue *actRetValue_3;
  undefined1 local_6a0 [4];
  Status myStatus_14;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  StrX local_640;
  XSValue *local_630;
  XSValue *actRetValue_2;
  undefined1 local_620 [4];
  Status myStatus_13;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  StrX local_5c0;
  XSValue *local_5b0;
  XSValue *actRetValue_1;
  undefined1 local_5a0 [4];
  Status myStatus_12;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  StrX local_540;
  XSValue *local_530;
  XSValue *actRetValue;
  Status myStatus_11;
  int i;
  StrX local_510;
  StrX local_500;
  byte local_4ed;
  Status local_4ec;
  undefined1 local_4e8 [3];
  bool actRetValid_10;
  Status myStatus_10;
  StrX local_4d8;
  StrX local_4c8;
  byte local_4b5;
  Status local_4b4;
  undefined1 local_4b0 [3];
  bool actRetValid_9;
  Status myStatus_9;
  StrX local_4a0;
  byte local_48d;
  Status local_48c;
  undefined1 local_488 [3];
  bool actRetValid_8;
  Status myStatus_8;
  StrX local_478;
  byte local_465;
  Status local_464;
  undefined1 local_460 [3];
  bool actRetValid_7;
  Status myStatus_7;
  StrX local_450;
  byte local_43d;
  Status local_43c;
  undefined1 local_438 [3];
  bool actRetValid_6;
  Status myStatus_6;
  StrX local_428;
  byte local_415;
  Status local_414;
  undefined1 local_410 [3];
  bool actRetValid_5;
  Status myStatus_5;
  StrX local_400;
  byte local_3ed;
  Status local_3ec;
  undefined1 local_3e8 [3];
  bool actRetValid_4;
  Status myStatus_4;
  StrX local_3d8;
  byte local_3c5;
  Status local_3c4;
  undefined1 local_3c0 [3];
  bool actRetValid_3;
  Status myStatus_3;
  StrX local_3b0;
  byte local_39d;
  Status local_39c;
  undefined1 local_398 [3];
  bool actRetValid_2;
  Status myStatus_2;
  StrX local_388;
  byte local_375;
  Status local_374;
  undefined1 local_370 [3];
  bool actRetValid_1;
  Status myStatus_1;
  StrX local_350;
  byte local_33d;
  Status local_33c;
  char acStack_338 [3];
  bool actRetValid;
  Status myStatus;
  char data_canrep_5 [9];
  char data_rawstr_5 [11];
  char data_canrep_4 [6];
  char data_rawstr_4 [11];
  char data_canrep_3 [10];
  char data_rawstr_3 [14];
  char data_canrep_2 [9];
  char data_rawstr_2 [8];
  char data_canrep_1 [10];
  char cStack_2b6;
  char cStack_2b5;
  char cStack_2b4;
  char cStack_2b3;
  char cStack_2b2;
  char cStack_2b1;
  char data_rawstr_1 [16];
  char local_2a0 [8];
  char lex_iv_2 [8];
  char lex_iv_1 [9];
  char local_286 [2];
  undefined4 local_284;
  char lex_v_ran_iv_4_canrep [2];
  char lex_v_ran_iv_3_canrep [2];
  char lex_v_ran_iv_2_canrep [5];
  char lex_v_ran_iv_1_canrep [4];
  XSValue_Data lex_iv_ran_v_4;
  XSValue_Data lex_iv_ran_v_3;
  XSValue_Data lex_iv_ran_v_2;
  XSValue_Data lex_iv_ran_v_1;
  char lex_v_ran_iv_4 [17];
  char acStack_1b8 [8];
  char lex_v_ran_iv_3 [17];
  char acStack_198 [8];
  char lex_v_ran_iv_2 [17];
  char acStack_178 [8];
  char lex_v_ran_iv_1 [17];
  XSValue_Data act_v_ran_v_4;
  XSValue_Data act_v_ran_v_3;
  XSValue_Data act_v_ran_v_2;
  XSValue_Data act_v_ran_v_1;
  XSValue_Data act_v_ran_v_0;
  char lex_v_ran_v_4 [17];
  char acStack_78 [8];
  char lex_v_ran_v_3 [17];
  char acStack_58 [8];
  char lex_v_ran_v_2 [17];
  char acStack_38 [8];
  char lex_v_ran_v_1 [17];
  char lex_v_ran_v_0 [15];
  bool toValidate;
  DataType dt;
  
  stack0xffffffffffffffe0 = 0x2e343332312020;
  builtin_strncpy(acStack_38,"+3.40282",8);
  lex_v_ran_v_1[0] = '3';
  lex_v_ran_v_1[1] = '4';
  lex_v_ran_v_1[2] = '6';
  lex_v_ran_v_1[3] = '6';
  lex_v_ran_v_1[4] = 'e';
  lex_v_ran_v_1[5] = '+';
  lex_v_ran_v_1[6] = '3';
  lex_v_ran_v_1[7] = '8';
  lex_v_ran_v_1[8] = '\0';
  builtin_strncpy(acStack_58,"-3.40282",8);
  builtin_strncpy(lex_v_ran_v_2,"3466e+38",9);
  builtin_strncpy(acStack_78,"+1.17549",8);
  builtin_strncpy(lex_v_ran_v_3,"4351e-38",9);
  act_v_ran_v_0.fValue.f_datetime.f_milisec = (double)0x39343537312e312d;
  act_v_ran_v_0.f_datatype = 0x55339215;
  act_v_ran_v_1.f_datatype = 0x7f7fffff;
  act_v_ran_v_2.f_datatype = 0xff7fffff;
  act_v_ran_v_3.f_datatype = 0x800000;
  act_v_ran_v_4.f_datatype = 0x80800000;
  builtin_strncpy(acStack_178,"+3.40282",8);
  builtin_strncpy(lex_v_ran_iv_1,"3466e+39",9);
  builtin_strncpy(acStack_198,"-3.40282",8);
  builtin_strncpy(lex_v_ran_iv_2,"3466e+39",9);
  builtin_strncpy(acStack_1b8,"+1.17549",8);
  builtin_strncpy(lex_v_ran_iv_3,"4351e-46",9);
  lex_iv_ran_v_1.fValue.f_datetime.f_milisec = (double)0x39343537312e312d;
  lex_iv_ran_v_1.f_datatype = dt_string;
  lex_iv_ran_v_1._4_4_ = 1;
  lex_iv_ran_v_2.f_datatype = dt_string;
  lex_iv_ran_v_2._4_4_ = 0;
  lex_iv_ran_v_3.f_datatype = dt_string;
  lex_iv_ran_v_3._4_4_ = 3;
  lex_iv_ran_v_4.f_datatype = dt_string;
  lex_iv_ran_v_4._4_4_ = 3;
  builtin_strncpy(lex_v_ran_iv_2_canrep,"INF",4);
  lex_v_ran_iv_4_canrep[0] = '\0';
  local_284 = 0x464e492d;
  local_286[0] = '0';
  local_286[1] = '\0';
  stack0xfffffffffffffd78 = 0x30;
  builtin_strncpy(lex_iv_2,"12x.e+10",8);
  lex_iv_1[0] = '\0';
  builtin_strncpy(local_2a0,"12.e+1x",8);
  data_canrep_1[8] = ' ';
  data_canrep_1[9] = ' ';
  cStack_2b6 = ' ';
  cStack_2b5 = '-';
  cStack_2b4 = '1';
  cStack_2b3 = '2';
  cStack_2b2 = '3';
  cStack_2b1 = '.';
  builtin_strncpy(data_rawstr_2,"-1.2345E",8);
  data_canrep_1[0] = '2';
  data_canrep_1[1] = '\0';
  stack0xfffffffffffffd30 = 0x35342e3332312b;
  stack0xfffffffffffffd20 = 0x3245353433322e31;
  data_canrep_2[0] = '\0';
  data_rawstr_3[0] = '+';
  data_rawstr_3[1] = '0';
  data_rawstr_3[2] = '0';
  data_rawstr_3[3] = '1';
  data_rawstr_3[4] = '2';
  data_rawstr_3[5] = '\0';
  stack0xfffffffffffffd10 = 0x342e3332312b;
  stack0xfffffffffffffd00 = 0x3145353433322e31;
  data_canrep_3[0] = '4';
  data_canrep_3[1] = '\0';
  _data_canrep_4 = 0x30302e3030312b;
  stack0xfffffffffffffce8 = 0x45302e31;
  stack0xfffffffffffffcd8 = 0x322e3030313030;
  _acStack_338 = 0x3445333230302e31;
  data_canrep_5[0] = '\0';
  local_33c = st_Init;
  StrX::StrX(&local_350,lex_v_ran_v_1 + 0x10);
  pXVar3 = StrX::unicodeForm(&local_350);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_float,&local_33c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_350);
  local_33d = bVar1 & 1;
  if (local_33d != 1) {
    pXVar3 = getDataTypeString(dt_float);
    StrX::StrX((StrX *)local_370,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_370);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3ea,lex_v_ran_v_1 + 0x10,pcVar4,1);
    StrX::~StrX((StrX *)local_370);
    errSeen = true;
  }
  local_374 = st_Init;
  StrX::StrX(&local_388,acStack_38);
  pXVar3 = StrX::unicodeForm(&local_388);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_float,&local_374,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_388);
  local_375 = bVar1 & 1;
  if (local_375 != 1) {
    pXVar3 = getDataTypeString(dt_float);
    StrX::StrX((StrX *)local_398,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_398);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3eb,acStack_38,pcVar4,1);
    StrX::~StrX((StrX *)local_398);
    errSeen = true;
  }
  local_39c = st_Init;
  StrX::StrX(&local_3b0,acStack_58);
  pXVar3 = StrX::unicodeForm(&local_3b0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_float,&local_39c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_3b0);
  local_39d = bVar1 & 1;
  if (local_39d != 1) {
    pXVar3 = getDataTypeString(dt_float);
    StrX::StrX((StrX *)local_3c0,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_3c0);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3ec,acStack_58,pcVar4,1);
    StrX::~StrX((StrX *)local_3c0);
    errSeen = true;
  }
  local_3c4 = st_Init;
  StrX::StrX(&local_3d8,acStack_78);
  pXVar3 = StrX::unicodeForm(&local_3d8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_float,&local_3c4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_3d8);
  local_3c5 = bVar1 & 1;
  if (local_3c5 != 1) {
    pXVar3 = getDataTypeString(dt_float);
    StrX::StrX((StrX *)local_3e8,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_3e8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3ed,acStack_78,pcVar4,1);
    StrX::~StrX((StrX *)local_3e8);
    errSeen = true;
  }
  local_3ec = st_Init;
  StrX::StrX(&local_400,(char *)((long)&act_v_ran_v_0.fValue + 0x18));
  pXVar3 = StrX::unicodeForm(&local_400);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_float,&local_3ec,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_400);
  local_3ed = bVar1 & 1;
  if (local_3ed != 1) {
    pXVar3 = getDataTypeString(dt_float);
    StrX::StrX((StrX *)local_410,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_410);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3ee,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4,1);
    StrX::~StrX((StrX *)local_410);
    errSeen = true;
  }
  local_414 = st_Init;
  StrX::StrX(&local_428,acStack_178);
  pXVar3 = StrX::unicodeForm(&local_428);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_float,&local_414,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_428);
  local_415 = bVar1 & 1;
  if (local_415 != 1) {
    pXVar3 = getDataTypeString(dt_float);
    StrX::StrX((StrX *)local_438,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_438);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f1,acStack_178,pcVar4,1);
    StrX::~StrX((StrX *)local_438);
    errSeen = true;
  }
  local_43c = st_Init;
  StrX::StrX(&local_450,acStack_198);
  pXVar3 = StrX::unicodeForm(&local_450);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_float,&local_43c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_450);
  local_43d = bVar1 & 1;
  if (local_43d != 1) {
    pXVar3 = getDataTypeString(dt_float);
    StrX::StrX((StrX *)local_460,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_460);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f2,acStack_198,pcVar4,1);
    StrX::~StrX((StrX *)local_460);
    errSeen = true;
  }
  local_464 = st_Init;
  StrX::StrX(&local_478,acStack_1b8);
  pXVar3 = StrX::unicodeForm(&local_478);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_float,&local_464,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_478);
  local_465 = bVar1 & 1;
  if (local_465 != 1) {
    pXVar3 = getDataTypeString(dt_float);
    StrX::StrX((StrX *)local_488,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_488);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f3,acStack_1b8,pcVar4,1);
    StrX::~StrX((StrX *)local_488);
    errSeen = true;
  }
  local_48c = st_Init;
  StrX::StrX(&local_4a0,(char *)((long)&lex_iv_ran_v_1.fValue + 0x18));
  pXVar3 = StrX::unicodeForm(&local_4a0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_float,&local_48c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_4a0);
  local_48d = bVar1 & 1;
  if (local_48d != 1) {
    pXVar3 = getDataTypeString(dt_float);
    StrX::StrX((StrX *)local_4b0,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_4b0);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f4,(undefined1 *)((long)&lex_iv_ran_v_1.fValue + 0x18),pcVar4,1);
    StrX::~StrX((StrX *)local_4b0);
    errSeen = true;
  }
  local_4b4 = st_Init;
  StrX::StrX(&local_4c8,lex_iv_2);
  pXVar3 = StrX::unicodeForm(&local_4c8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_float,&local_4b4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_4c8);
  local_4b5 = bVar1 & 1;
  if (local_4b5 == 0) {
    if (local_4b4 != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX((StrX *)local_4e8,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_4e8);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_4b4);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x3f7,lex_iv_2,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_4e8);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_float);
    StrX::StrX(&local_4d8,pXVar3);
    pcVar4 = StrX::localForm(&local_4d8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f7,lex_iv_2,pcVar4,0);
    StrX::~StrX(&local_4d8);
    errSeen = true;
  }
  local_4ec = st_Init;
  StrX::StrX(&local_500,local_2a0);
  pXVar3 = StrX::unicodeForm(&local_500);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_float,&local_4ec,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_500);
  local_4ed = bVar1 & 1;
  if (local_4ed == 0) {
    if (local_4ec != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX((StrX *)&myStatus_11,pXVar3);
      pcVar4 = StrX::localForm((StrX *)&myStatus_11);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_4ec);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x3f8,local_2a0,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)&myStatus_11);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_float);
    StrX::StrX(&local_510,pXVar3);
    pcVar4 = StrX::localForm(&local_510);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f8,local_2a0,pcVar4,0);
    StrX::~StrX(&local_510);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    bVar11 = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = 0;
    StrX::StrX(&local_540,lex_v_ran_v_1 + 0x10);
    pXVar3 = StrX::unicodeForm(&local_540);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_float,(Status *)&actRetValue,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_540);
    local_530 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX((StrX *)local_5a0,pXVar3);
      StrX::localForm((StrX *)local_5a0);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x416,lex_v_ran_v_1 + 0x10);
      StrX::~StrX((StrX *)local_5a0);
      errSeen = true;
    }
    else {
      memcpy(&local_568,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_1.fValue + 0x18);
      memcpy(&local_590,pvVar10,0x28);
      actValue.fValue.f_long = uStack_560;
      actValue._0_8_ = local_568;
      actValue.fValue._8_8_ = local_558;
      actValue.fValue._16_8_ = uStack_550;
      actValue.fValue.f_datetime.f_milisec = (double)local_548;
      expValue.fValue.f_long = uStack_588;
      expValue._0_8_ = local_590;
      expValue.fValue._8_8_ = local_580;
      expValue.fValue._16_8_ = uStack_578;
      expValue.fValue.f_datetime.f_milisec = (double)local_570;
      bVar2 = compareActualValue(dt_float,actValue,expValue);
      pXVar5 = local_530;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_530 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_530);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_1._4_4_ = 0;
    StrX::StrX(&local_5c0,acStack_38);
    pXVar3 = StrX::unicodeForm(&local_5c0);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_float,(Status *)((long)&actRetValue_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_5c0);
    local_5b0 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX((StrX *)local_620,pXVar3);
      StrX::localForm((StrX *)local_620);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x417,acStack_38);
      StrX::~StrX((StrX *)local_620);
      errSeen = true;
    }
    else {
      memcpy(&local_5e8,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_2.fValue + 0x18);
      memcpy(&local_610,pvVar10,0x28);
      actValue_00.fValue.f_long = uStack_5e0;
      actValue_00._0_8_ = local_5e8;
      actValue_00.fValue._8_8_ = local_5d8;
      actValue_00.fValue._16_8_ = uStack_5d0;
      actValue_00.fValue.f_datetime.f_milisec = (double)local_5c8;
      expValue_00.fValue.f_long = uStack_608;
      expValue_00._0_8_ = local_610;
      expValue_00.fValue._8_8_ = local_600;
      expValue_00.fValue._16_8_ = uStack_5f8;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_5f0;
      bVar2 = compareActualValue(dt_float,actValue_00,expValue_00);
      pXVar5 = local_5b0;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_5b0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_5b0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_2._4_4_ = 0;
    StrX::StrX(&local_640,acStack_58);
    pXVar3 = StrX::unicodeForm(&local_640);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_float,(Status *)((long)&actRetValue_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_640);
    local_630 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX((StrX *)local_6a0,pXVar3);
      StrX::localForm((StrX *)local_6a0);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x418,acStack_58);
      StrX::~StrX((StrX *)local_6a0);
      errSeen = true;
    }
    else {
      memcpy(&local_668,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_3.fValue + 0x18);
      memcpy(&local_690,pvVar10,0x28);
      actValue_01.fValue.f_long = uStack_660;
      actValue_01._0_8_ = local_668;
      actValue_01.fValue._8_8_ = local_658;
      actValue_01.fValue._16_8_ = uStack_650;
      actValue_01.fValue.f_datetime.f_milisec = (double)local_648;
      expValue_01.fValue.f_long = uStack_688;
      expValue_01._0_8_ = local_690;
      expValue_01.fValue._8_8_ = local_680;
      expValue_01.fValue._16_8_ = uStack_678;
      expValue_01.fValue.f_datetime.f_milisec = (double)local_670;
      bVar2 = compareActualValue(dt_float,actValue_01,expValue_01);
      pXVar5 = local_630;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_630 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_630);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_3._4_4_ = 0;
    StrX::StrX(&local_6c0,acStack_78);
    pXVar3 = StrX::unicodeForm(&local_6c0);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_float,(Status *)((long)&actRetValue_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_6c0);
    local_6b0 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX((StrX *)local_720,pXVar3);
      StrX::localForm((StrX *)local_720);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x419,acStack_78);
      StrX::~StrX((StrX *)local_720);
      errSeen = true;
    }
    else {
      memcpy(&local_6e8,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_4.fValue + 0x18);
      memcpy(&local_710,pvVar10,0x28);
      actValue_02.fValue.f_long = uStack_6e0;
      actValue_02._0_8_ = local_6e8;
      actValue_02.fValue._8_8_ = local_6d8;
      actValue_02.fValue._16_8_ = uStack_6d0;
      actValue_02.fValue.f_datetime.f_milisec = (double)local_6c8;
      expValue_02.fValue.f_long = uStack_708;
      expValue_02._0_8_ = local_710;
      expValue_02.fValue._8_8_ = local_700;
      expValue_02.fValue._16_8_ = uStack_6f8;
      expValue_02.fValue.f_datetime.f_milisec = (double)local_6f0;
      bVar2 = compareActualValue(dt_float,actValue_02,expValue_02);
      pXVar5 = local_6b0;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_6b0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_6b0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_4._4_4_ = 0;
    StrX::StrX(&local_740,(char *)((long)&act_v_ran_v_0.fValue + 0x18));
    pXVar3 = StrX::unicodeForm(&local_740);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_float,(Status *)((long)&actRetValue_4 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_740);
    local_730 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX((StrX *)local_7a0,pXVar3);
      StrX::localForm((StrX *)local_7a0);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x41a,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18));
      StrX::~StrX((StrX *)local_7a0);
      errSeen = true;
    }
    else {
      memcpy(&local_768,pXVar5,0x28);
      pcVar4 = lex_v_ran_iv_1 + 0x10;
      memcpy(&local_790,pcVar4,0x28);
      actValue_03.fValue.f_long = uStack_760;
      actValue_03._0_8_ = local_768;
      actValue_03.fValue._8_8_ = local_758;
      actValue_03.fValue._16_8_ = uStack_750;
      actValue_03.fValue.f_datetime.f_milisec = (double)local_748;
      expValue_03.fValue.f_long = uStack_788;
      expValue_03._0_8_ = local_790;
      expValue_03.fValue._8_8_ = local_780;
      expValue_03.fValue._16_8_ = uStack_778;
      expValue_03.fValue.f_datetime.f_milisec = (double)local_770;
      bVar2 = compareActualValue(dt_float,actValue_03,expValue_03);
      pXVar5 = local_730;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_730 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_730);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pcVar4);
      }
    }
    actRetValue_5._4_4_ = 0;
    StrX::StrX(&local_7c0,acStack_178);
    pXVar3 = StrX::unicodeForm(&local_7c0);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_float,(Status *)((long)&actRetValue_5 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_7c0);
    local_7b0 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX((StrX *)local_820,pXVar3);
      StrX::localForm((StrX *)local_820);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x41d,acStack_178);
      StrX::~StrX((StrX *)local_820);
      errSeen = true;
    }
    else {
      memcpy(&local_7e8,pXVar5,0x28);
      pvVar10 = (void *)((long)&lex_iv_ran_v_2.fValue + 0x18);
      memcpy(&local_810,pvVar10,0x28);
      actValue_04.fValue.f_long = uStack_7e0;
      actValue_04._0_8_ = local_7e8;
      actValue_04.fValue._8_8_ = local_7d8;
      actValue_04.fValue._16_8_ = uStack_7d0;
      actValue_04.fValue.f_datetime.f_milisec = (double)local_7c8;
      expValue_04.fValue.f_long = uStack_808;
      expValue_04._0_8_ = local_810;
      expValue_04.fValue._8_8_ = local_800;
      expValue_04.fValue._16_8_ = uStack_7f8;
      expValue_04.fValue.f_datetime.f_milisec = (double)local_7f0;
      bVar2 = compareActualValue(dt_float,actValue_04,expValue_04);
      pXVar5 = local_7b0;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_7b0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_7b0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_6._4_4_ = 0;
    StrX::StrX(&local_840,acStack_198);
    pXVar3 = StrX::unicodeForm(&local_840);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_float,(Status *)((long)&actRetValue_6 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_840);
    local_830 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX((StrX *)local_8a0,pXVar3);
      StrX::localForm((StrX *)local_8a0);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x41e,acStack_198);
      StrX::~StrX((StrX *)local_8a0);
      errSeen = true;
    }
    else {
      memcpy(&local_868,pXVar5,0x28);
      pvVar10 = (void *)((long)&lex_iv_ran_v_3.fValue + 0x18);
      memcpy(&local_890,pvVar10,0x28);
      actValue_05.fValue.f_long = uStack_860;
      actValue_05._0_8_ = local_868;
      actValue_05.fValue._8_8_ = local_858;
      actValue_05.fValue._16_8_ = uStack_850;
      actValue_05.fValue.f_datetime.f_milisec = (double)local_848;
      expValue_05.fValue.f_long = uStack_888;
      expValue_05._0_8_ = local_890;
      expValue_05.fValue._8_8_ = local_880;
      expValue_05.fValue._16_8_ = uStack_878;
      expValue_05.fValue.f_datetime.f_milisec = (double)local_870;
      bVar2 = compareActualValue(dt_float,actValue_05,expValue_05);
      pXVar5 = local_830;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_830 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_830);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_7._4_4_ = 0;
    StrX::StrX(&local_8c0,acStack_1b8);
    pXVar3 = StrX::unicodeForm(&local_8c0);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_float,(Status *)((long)&actRetValue_7 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_8c0);
    local_8b0 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX((StrX *)local_920,pXVar3);
      StrX::localForm((StrX *)local_920);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x41f,acStack_1b8);
      StrX::~StrX((StrX *)local_920);
      errSeen = true;
    }
    else {
      memcpy(&local_8e8,pXVar5,0x28);
      pvVar10 = (void *)((long)&lex_iv_ran_v_4.fValue + 0x18);
      memcpy(&local_910,pvVar10,0x28);
      actValue_06.fValue.f_long = uStack_8e0;
      actValue_06._0_8_ = local_8e8;
      actValue_06.fValue._8_8_ = local_8d8;
      actValue_06.fValue._16_8_ = uStack_8d0;
      actValue_06.fValue.f_datetime.f_milisec = (double)local_8c8;
      expValue_06.fValue.f_long = uStack_908;
      expValue_06._0_8_ = local_910;
      expValue_06.fValue._8_8_ = local_900;
      expValue_06.fValue._16_8_ = uStack_8f8;
      expValue_06.fValue.f_datetime.f_milisec = (double)local_8f0;
      bVar2 = compareActualValue(dt_float,actValue_06,expValue_06);
      pXVar5 = local_8b0;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_8b0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_8b0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_8._4_4_ = 0;
    StrX::StrX(&local_940,(char *)((long)&lex_iv_ran_v_1.fValue + 0x18));
    pXVar3 = StrX::unicodeForm(&local_940);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_float,(Status *)((long)&actRetValue_8 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_940);
    local_930 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX((StrX *)local_9a0,pXVar3);
      StrX::localForm((StrX *)local_9a0);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x420,(undefined1 *)((long)&lex_iv_ran_v_1.fValue + 0x18));
      StrX::~StrX((StrX *)local_9a0);
      errSeen = true;
    }
    else {
      memcpy(&local_968,pXVar5,0x28);
      pcVar4 = lex_v_ran_iv_2_canrep + 4;
      memcpy(&local_990,pcVar4,0x28);
      actValue_07.fValue.f_long = uStack_960;
      actValue_07._0_8_ = local_968;
      actValue_07.fValue._8_8_ = local_958;
      actValue_07.fValue._16_8_ = uStack_950;
      actValue_07.fValue.f_datetime.f_milisec = (double)local_948;
      expValue_07.fValue.f_long = uStack_988;
      expValue_07._0_8_ = local_990;
      expValue_07.fValue._8_8_ = local_980;
      expValue_07.fValue._16_8_ = uStack_978;
      expValue_07.fValue.f_datetime.f_milisec = (double)local_970;
      bVar2 = compareActualValue(dt_float,actValue_07,expValue_07);
      pXVar5 = local_930;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_930 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_930);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pcVar4);
      }
    }
    actRetValue_9._4_4_ = st_Init;
    StrX::StrX(&local_9c0,lex_iv_2);
    pXVar3 = StrX::unicodeForm(&local_9c0);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_float,(Status *)((long)&actRetValue_9 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_9c0);
    local_9b0 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_9._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_float);
        StrX::StrX((StrX *)local_9e0,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_9e0);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_9._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x423,lex_iv_2,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_9e0);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX(&local_9d0,pXVar3);
      StrX::localForm(&local_9d0);
      pvVar10 = (void *)0x423;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x423,lex_iv_2);
      StrX::~StrX(&local_9d0);
      pXVar5 = local_9b0;
      errSeen = true;
      if (local_9b0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_9b0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_10._4_4_ = st_Init;
    StrX::StrX(&local_a00,local_2a0);
    pXVar3 = StrX::unicodeForm(&local_a00);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_float,(Status *)((long)&actRetValue_10 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_a00);
    local_9f0 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_10._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_float);
        StrX::StrX((StrX *)&myStatus_22,pXVar3);
        pcVar4 = StrX::localForm((StrX *)&myStatus_22);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_10._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x424,local_2a0,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)&myStatus_22);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX(&local_a10,pXVar3);
      StrX::localForm(&local_a10);
      pvVar10 = (void *)0x424;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x424,local_2a0);
      StrX::~StrX(&local_a10);
      pXVar5 = local_9f0;
      errSeen = true;
      if (local_9f0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_9f0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    bVar11 = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar,data_canrep_1 + 8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_float,(Status *)&actRetCanRep,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar);
    local_a30 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX((StrX *)local_a68,pXVar3);
      StrX::localForm((StrX *)local_a68);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x444,data_canrep_1 + 8);
      StrX::~StrX((StrX *)local_a68);
      errSeen = true;
    }
    else {
      local_a48 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_a48,data_rawstr_2);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_float);
        StrX::StrX(&local_a58,pXVar3);
        pcVar4 = StrX::localForm(&local_a58);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x444,data_canrep_1 + 8,pcVar4,local_a48,data_rawstr_2);
        StrX::~StrX(&local_a58);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_a30);
      xercesc_4_0::XMLString::release(&local_a48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_1._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_1,data_canrep_2 + 8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_1);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_float,(Status *)((long)&actRetCanRep_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_1);
    local_a78 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX((StrX *)local_ab0,pXVar3);
      StrX::localForm((StrX *)local_ab0);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x445,data_canrep_2 + 8);
      StrX::~StrX((StrX *)local_ab0);
      errSeen = true;
    }
    else {
      local_a90 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_a90,data_rawstr_3 + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_float);
        StrX::StrX(&local_aa0,pXVar3);
        pcVar4 = StrX::localForm(&local_aa0);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x445,data_canrep_2 + 8,pcVar4,local_a90,data_rawstr_3 + 8);
        StrX::~StrX(&local_aa0);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_a78);
      xercesc_4_0::XMLString::release(&local_a90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_2._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_2,data_canrep_3 + 8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_2);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_float,(Status *)((long)&actRetCanRep_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_2);
    local_ac0 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX((StrX *)local_af8,pXVar3);
      StrX::localForm((StrX *)local_af8);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x446,data_canrep_3 + 8);
      StrX::~StrX((StrX *)local_af8);
      errSeen = true;
    }
    else {
      local_ad8 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_ad8,data_rawstr_4 + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_float);
        StrX::StrX(&local_ae8,pXVar3);
        pcVar4 = StrX::localForm(&local_ae8);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x446,data_canrep_3 + 8,pcVar4,local_ad8,data_rawstr_4 + 8);
        StrX::~StrX(&local_ae8);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_ac0);
      xercesc_4_0::XMLString::release(&local_ad8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_3._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_3,data_canrep_4);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_3);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_float,(Status *)((long)&actRetCanRep_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_3);
    local_b08 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX((StrX *)local_b40,pXVar3);
      StrX::localForm((StrX *)local_b40);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x447,data_canrep_4);
      StrX::~StrX((StrX *)local_b40);
      errSeen = true;
    }
    else {
      local_b20 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_b20,data_rawstr_5 + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_float);
        StrX::StrX(&local_b30,pXVar3);
        pcVar4 = StrX::localForm(&local_b30);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x447,data_canrep_4,pcVar4,local_b20,data_rawstr_5 + 8);
        StrX::~StrX(&local_b30);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_b08);
      xercesc_4_0::XMLString::release(&local_b20,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_4._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_4,data_canrep_5 + 8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_4);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_float,(Status *)((long)&actRetCanRep_4 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_4);
    local_b50 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX((StrX *)local_b88,pXVar3);
      StrX::localForm((StrX *)local_b88);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x448,data_canrep_5 + 8);
      StrX::~StrX((StrX *)local_b88);
      errSeen = true;
    }
    else {
      local_b68 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_b68,acStack_338);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_float);
        StrX::StrX(&local_b78,pXVar3);
        pcVar4 = StrX::localForm(&local_b78);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x448,data_canrep_5 + 8,pcVar4,local_b68,acStack_338);
        StrX::~StrX(&local_b78);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_b50);
      xercesc_4_0::XMLString::release(&local_b68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_5._4_4_ = st_Init;
    StrX::StrX(&local_ba8,lex_iv_2);
    pXVar3 = StrX::unicodeForm(&local_ba8);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_float,(Status *)((long)&actRetCanRep_5 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_ba8);
    local_b98 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_5._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_float);
        StrX::StrX((StrX *)local_bc8,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_bc8);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_5._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,1099,lex_iv_2,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_bc8);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX(&local_bb8,pXVar3);
      StrX::localForm(&local_bb8);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,1099,lex_iv_2);
      StrX::~StrX(&local_bb8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_b98);
      errSeen = true;
    }
    actRetCanRep_6._4_4_ = st_Init;
    StrX::StrX(&local_be8,local_2a0);
    pXVar3 = StrX::unicodeForm(&local_be8);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_float,(Status *)((long)&actRetCanRep_6 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_be8);
    local_bd8 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_6._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_float);
        StrX::StrX((StrX *)local_c08,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_c08);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_6._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x44c,local_2a0,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_c08);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX(&local_bf8,pXVar3);
      StrX::localForm(&local_bf8);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x44c,local_2a0);
      StrX::~StrX(&local_bf8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_bd8);
      errSeen = true;
    }
    actRetCanRep_7._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_5,acStack_178);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_5);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_float,(Status *)((long)&actRetCanRep_7 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_5);
    local_c18 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX((StrX *)local_c50,pXVar3);
      StrX::localForm((StrX *)local_c50);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x44f,acStack_178);
      StrX::~StrX((StrX *)local_c50);
      errSeen = true;
    }
    else {
      local_c30 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_c30,lex_v_ran_iv_2_canrep);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_float);
        StrX::StrX(&local_c40,pXVar3);
        pcVar4 = StrX::localForm(&local_c40);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x44f,acStack_178,pcVar4,local_c30,lex_v_ran_iv_2_canrep);
        StrX::~StrX(&local_c40);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_c18);
      xercesc_4_0::XMLString::release(&local_c30,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_8._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_6,acStack_198);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_6);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_float,(Status *)((long)&actRetCanRep_8 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_6);
    local_c60 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX((StrX *)local_c98,pXVar3);
      StrX::localForm((StrX *)local_c98);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x450,acStack_198);
      StrX::~StrX((StrX *)local_c98);
      errSeen = true;
    }
    else {
      local_c78 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_c78,(char *)&local_284);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_float);
        StrX::StrX(&local_c88,pXVar3);
        pcVar4 = StrX::localForm(&local_c88);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x450,acStack_198,pcVar4,local_c78,&local_284);
        StrX::~StrX(&local_c88);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_c60);
      xercesc_4_0::XMLString::release(&local_c78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_9._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_7,acStack_1b8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_7);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_float,(Status *)((long)&actRetCanRep_9 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_7);
    local_ca8 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX((StrX *)local_ce0,pXVar3);
      StrX::localForm((StrX *)local_ce0);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x451,acStack_1b8);
      StrX::~StrX((StrX *)local_ce0);
      errSeen = true;
    }
    else {
      local_cc0 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_cc0,local_286);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_float);
        StrX::StrX(&local_cd0,pXVar3);
        pcVar4 = StrX::localForm(&local_cd0);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x451,acStack_1b8,pcVar4,local_cc0,local_286);
        StrX::~StrX(&local_cd0);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_ca8);
      xercesc_4_0::XMLString::release(&local_cc0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_10._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_8,(char *)((long)&lex_iv_ran_v_1.fValue + 0x18));
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_8);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_float,(Status *)((long)&actRetCanRep_10 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_8);
    local_cf0 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_float);
      StrX::StrX(&local_d28,pXVar3);
      StrX::localForm(&local_d28);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x452,(undefined1 *)((long)&lex_iv_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_d28);
      errSeen = true;
    }
    else {
      local_d08 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar11 = xercesc_4_0::XMLString::equals(local_d08,lex_iv_1 + 8);
      if (!bVar11) {
        pXVar3 = getDataTypeString(dt_float);
        StrX::StrX(&local_d18,pXVar3);
        pcVar4 = StrX::localForm(&local_d18);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x452,(undefined1 *)((long)&lex_iv_ran_v_1.fValue + 0x18),pcVar4,local_d08,
               lex_iv_1 + 8);
        StrX::~StrX(&local_d18);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_cf0);
      xercesc_4_0::XMLString::release(&local_d08,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
  }
  return;
}

Assistant:

void test_dt_float()
{

    const XSValue::DataType dt = XSValue::dt_float;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="  1234.e+10  \n";
    const char lex_v_ran_v_1[]="+3.402823466e+38";
    const char lex_v_ran_v_2[]="-3.402823466e+38";
    const char lex_v_ran_v_3[]="+1.175494351e-38";
    const char lex_v_ran_v_4[]="-1.175494351e-38";

    XSValue::XSValue_Data act_v_ran_v_0; act_v_ran_v_0.fValue.f_float = (float)1234.e+10;
    XSValue::XSValue_Data act_v_ran_v_1; act_v_ran_v_1.fValue.f_float = (float)+3.402823466e+38;
    XSValue::XSValue_Data act_v_ran_v_2; act_v_ran_v_2.fValue.f_float = (float)-3.402823466e+38;
    XSValue::XSValue_Data act_v_ran_v_3; act_v_ran_v_3.fValue.f_float = (float)+1.175494351e-38;
    XSValue::XSValue_Data act_v_ran_v_4; act_v_ran_v_4.fValue.f_float = (float)-1.175494351e-38;

    const char lex_v_ran_iv_1[]="+3.402823466e+39";
    const char lex_v_ran_iv_2[]="-3.402823466e+39";
    const char lex_v_ran_iv_3[]="+1.175494351e-46";
    const char lex_v_ran_iv_4[]="-1.175494351e-46";

    XSValue::XSValue_Data lex_iv_ran_v_1; lex_iv_ran_v_1.fValue.f_float = (float)0.0;
    lex_iv_ran_v_1.fValue.f_floatType.f_floatEnum = XSValue::DoubleFloatType_PosINF;
    XSValue::XSValue_Data lex_iv_ran_v_2; lex_iv_ran_v_2.fValue.f_float = (float)0.0;
    lex_iv_ran_v_2.fValue.f_floatType.f_floatEnum = XSValue::DoubleFloatType_NegINF;
    XSValue::XSValue_Data lex_iv_ran_v_3; lex_iv_ran_v_3.fValue.f_float = (float)0.0;
    lex_iv_ran_v_3.fValue.f_floatType.f_floatEnum = XSValue::DoubleFloatType_Zero;
    XSValue::XSValue_Data lex_iv_ran_v_4; lex_iv_ran_v_4.fValue.f_float = (float)0.0;
    lex_iv_ran_v_4.fValue.f_floatType.f_floatEnum = XSValue::DoubleFloatType_Zero;

    const char lex_v_ran_iv_1_canrep[]="INF";  // " 3.402823466E39"
    const char lex_v_ran_iv_2_canrep[]="-INF"; // "-3.402823466E39";
    const char lex_v_ran_iv_3_canrep[]="0";    // " 1.175494351E-46";
    const char lex_v_ran_iv_4_canrep[]="0";    // "-1.175494351E-46";

    const char lex_iv_1[]="12x.e+10";
    const char lex_iv_2[]="12.e+1x";

/***
 * 3.2.4.2 Canonical representation
 *
 * The canonical representation for float is defined by prohibiting certain options from the Lexical
 * representation (3.2.4.1).
 * Specifically,
 * 1. the exponent must be indicated by "E".
 * 2. Leading zeroes and the preceding optional "+" sign are prohibited in the exponent.
 * 3. For the mantissa, the preceding optional "+" sign is prohibited and the decimal point is required.
 *    Leading and trailing zeroes are prohibited subject to the following:
 *    number representations must be normalized such that there is a single digit to the left of the decimal point
 *    and at least a single digit to the right of the decimal point.
 *
 ***/

    const char data_rawstr_1[]="   -123.45    \n";
    const char data_canrep_1[]="-1.2345E2";
    const char data_rawstr_2[]="+123.45";
    const char data_canrep_2[]="1.2345E2";
    const char data_rawstr_3[]="+123.45e+0012";
    const char data_canrep_3[]="1.2345E14";
    const char data_rawstr_4[]="+100.000e2";
    const char data_canrep_4[]="1.0E4";
    const char data_rawstr_5[]="00100.23e2";
    const char data_canrep_5[]="1.0023E4";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, range valid
    VALIDATE_TEST(lex_v_ran_v_0 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_3 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_4 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, range invalid
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_3 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_4 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        // lexical valid, range valid
        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_v_3,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_3);
        ACTVALUE_TEST(lex_v_ran_v_4,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_4);

        // lexical valid, range invalid
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_3, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_3);
        ACTVALUE_TEST(lex_v_ran_iv_4, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_4);

        // lexical invalid
        ACTVALUE_TEST(lex_iv_1      , dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2      , dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                            XMLCh          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        // lexical valid, range valid
        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    DONT_CARE);
        CANREP_TEST(data_rawstr_3,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_3,    DONT_CARE);
        CANREP_TEST(data_rawstr_4,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_4,    DONT_CARE);
        CANREP_TEST(data_rawstr_5,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_5,    DONT_CARE);

        // lexical invalid
        CANREP_TEST(lex_iv_1,         dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2,         dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);

        // lexical valid, range invalid (however XML4C ignores that)
        CANREP_TEST(lex_v_ran_iv_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep,    DONT_CARE);
        CANREP_TEST(lex_v_ran_iv_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep,    DONT_CARE);
        CANREP_TEST(lex_v_ran_iv_3,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_3_canrep,    DONT_CARE);
        CANREP_TEST(lex_v_ran_iv_4,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_4_canrep,    DONT_CARE);
    }
}